

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

bool __thiscall qpdf::Array::insert(Array *this,int at,QPDFObjectHandle *item)

{
  bool bVar1;
  QPDF_Array *this_00;
  pointer ppVar2;
  key_type *pkVar3;
  pointer pSVar4;
  mapped_type *this_01;
  QPDFObjectHandle local_f8;
  QPDFObjectHandle local_e8;
  __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_d8;
  const_iterator local_d0;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8 [2];
  insert_return_type local_98;
  undefined1 local_70 [8];
  node_type nh;
  int local_4c;
  undefined1 local_48 [4];
  int key;
  undefined1 local_40 [8];
  const_reverse_iterator iter;
  int sz;
  QPDF_Array *a;
  QPDFObjectHandle *item_local;
  Array *pAStack_18;
  int at_local;
  Array *this_local;
  
  item_local._4_4_ = at;
  pAStack_18 = this;
  this_00 = array(this);
  iter.current._M_node._4_4_ = size(this);
  if ((item_local._4_4_ < 0) || (iter.current._M_node._4_4_ < item_local._4_4_)) {
    this_local._7_1_ = false;
  }
  else {
    if (item_local._4_4_ == iter.current._M_node._4_4_) {
      push_back(this,item);
    }
    else {
      checkOwnership(this,item);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
      if (bVar1) {
        std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::operator->
                  (&this_00->sp);
        std::
        map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
        ::crbegin((map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                   *)local_40);
        while( true ) {
          std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::operator->
                    (&this_00->sp);
          std::
          map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::crend((map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                   *)local_48);
          bVar1 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>
                                   *)local_40,
                                  (reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>
                                   *)local_48);
          if (!bVar1) break;
          std::
          reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>::
          operator++((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>
                      *)&nh._M_pmapped,(int)local_40);
          ppVar2 = std::
                   reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>
                   ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>
                                 *)&nh._M_pmapped);
          local_4c = ppVar2->first;
          if (local_4c < item_local._4_4_) break;
          pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->(&this_00->sp);
          std::
          map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::extract((node_type *)local_70,&pSVar4->elements,&local_4c);
          pkVar3 = std::
                   _Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                   ::key((node_type *)local_70);
          *pkVar3 = *pkVar3 + 1;
          pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->(&this_00->sp);
          std::
          map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::insert(&local_98,&pSVar4->elements,(node_type *)local_70);
          std::
          _Node_insert_return<std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>,_std::_Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>_>
          ::~_Node_insert_return(&local_98);
          std::
          _Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
          ::~_Node_handle((_Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                           *)local_70);
        }
        QPDFObjectHandle::getObj(&local_c8);
        QPDFObjectHandle::QPDFObjectHandle(local_b8,(shared_ptr<QPDFObject> *)&local_c8);
        pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->(&this_00->sp);
        this_01 = std::
                  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                  ::operator[](&pSVar4->elements,(key_type *)((long)&item_local + 4));
        QPDFObjectHandle::operator=(this_01,local_b8);
        QPDFObjectHandle::~QPDFObjectHandle(local_b8);
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_c8);
        pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->(&this_00->sp);
        pSVar4->size = pSVar4->size + 1;
      }
      else {
        local_d8._M_current =
             (QPDFObjectHandle *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::cbegin
                       (&this_00->elements);
        local_d0._M_current =
             (QPDFObjectHandle *)
             __gnu_cxx::
             __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator+(&local_d8,(long)item_local._4_4_);
        QPDFObjectHandle::getObj(&local_f8);
        QPDFObjectHandle::QPDFObjectHandle(&local_e8,(shared_ptr<QPDFObject> *)&local_f8);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::insert
                  (&this_00->elements,local_d0,&local_e8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_f8);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Array::insert(int at, QPDFObjectHandle const& item)
{
    auto a = array();
    int sz = size();
    if (at < 0 || at > sz) {
        // As special case, also allow insert beyond the end
        return false;
    } else if (at == sz) {
        push_back(item);
    } else {
        checkOwnership(item);
        if (a->sp) {
            auto iter = a->sp->elements.crbegin();
            while (iter != a->sp->elements.crend()) {
                auto key = (iter++)->first;
                if (key >= at) {
                    auto nh = a->sp->elements.extract(key);
                    ++nh.key();
                    a->sp->elements.insert(std::move(nh));
                } else {
                    break;
                }
            }
            a->sp->elements[at] = item.getObj();
            ++a->sp->size;
        } else {
            a->elements.insert(a->elements.cbegin() + at, item.getObj());
        }
    }
    return true;
}